

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O2

REF_STATUS ref_edge_ghost_glob(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_GLOB *data)

{
  REF_INT *pRVar1;
  void *__ptr;
  uint uVar2;
  REF_INT *send_size;
  long lVar3;
  REF_INT *pRVar4;
  ulong uVar5;
  void *pvVar6;
  undefined4 *__ptr_00;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  int local_9c;
  ulong local_98;
  int local_8c;
  REF_NODE local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  REF_INT *local_60;
  REF_INT node1;
  REF_INT node0;
  REF_GLOB *local_50;
  ulong local_48;
  ulong local_40;
  void *local_38;
  
  lVar12 = (long)ref_mpi->n;
  if (lVar12 < 2) {
    return 0;
  }
  local_88 = ref_edge->node;
  send_size = (REF_INT *)malloc(lVar12 * 4);
  if (send_size == (REF_INT *)0x0) {
    pcVar11 = "malloc a_size of REF_INT NULL";
    uVar8 = 0x113;
  }
  else {
    for (lVar3 = 0; lVar12 != lVar3; lVar3 = lVar3 + 1) {
      send_size[lVar3] = 0;
    }
    pRVar4 = (REF_INT *)malloc(lVar12 * 4);
    if (pRVar4 == (REF_INT *)0x0) {
      pcVar11 = "malloc b_size of REF_INT NULL";
      uVar8 = 0x114;
    }
    else {
      for (lVar3 = 0; lVar12 != lVar3; lVar3 = lVar3 + 1) {
        pRVar4[lVar3] = 0;
      }
      iVar7 = ref_edge->n;
      iVar9 = 0;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      local_60 = pRVar4;
      local_50 = data;
      for (; pRVar4 = local_60, iVar7 != iVar9; iVar9 = iVar9 + 1) {
        ref_edge_part(ref_edge,iVar9,&local_9c);
        if (local_9c != ref_mpi->id) {
          send_size[local_9c] = send_size[local_9c] + 1;
        }
      }
      uVar2 = ref_mpi_alltoall(ref_mpi,send_size,local_60,1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x11c,"ref_edge_ghost_glob",(ulong)uVar2,"alltoall sizes");
        return uVar2;
      }
      uVar2 = ref_mpi->n;
      uVar5 = 0;
      uVar13 = 0;
      if (0 < (int)uVar2) {
        uVar13 = (ulong)uVar2;
      }
      uVar10 = 0;
      for (; uVar13 != uVar5; uVar5 = uVar5 + 1) {
        uVar10 = uVar10 + send_size[uVar5];
      }
      if ((int)uVar10 < 0) {
        pcVar11 = "malloc a_nodes of REF_GLOB negative";
        uVar8 = 0x120;
        goto LAB_001acbb9;
      }
      local_98 = (ulong)uVar2;
      pvVar6 = malloc((ulong)(uVar10 * 2) << 3);
      if (pvVar6 == (void *)0x0) {
        pcVar11 = "malloc a_nodes of REF_GLOB NULL";
        uVar8 = 0x120;
      }
      else {
        uVar5 = (ulong)uVar10;
        local_68 = pvVar6;
        pvVar6 = malloc(uVar5 * 8);
        if (pvVar6 == (void *)0x0) {
          pcVar11 = "malloc a_data of REF_GLOB NULL";
          uVar8 = 0x121;
        }
        else {
          local_40 = uVar5;
          local_38 = pvVar6;
          local_70 = malloc(uVar5 * 4);
          if (local_70 == (void *)0x0) {
            pcVar11 = "malloc a_edge of REF_INT NULL";
            uVar8 = 0x122;
          }
          else {
            uVar2 = 0;
            for (uVar5 = 0; uVar13 != uVar5; uVar5 = uVar5 + 1) {
              uVar2 = uVar2 + pRVar4[uVar5];
            }
            if ((int)uVar2 < 0) {
              pcVar11 = "malloc b_nodes of REF_GLOB negative";
              uVar8 = 0x126;
LAB_001acbb9:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                     ,uVar8,"ref_edge_ghost_glob",pcVar11);
              return 1;
            }
            pvVar6 = malloc((ulong)(uVar2 * 2) << 3);
            if (pvVar6 == (void *)0x0) {
              pcVar11 = "malloc b_nodes of REF_GLOB NULL";
              uVar8 = 0x126;
            }
            else {
              local_48 = (ulong)uVar2 << 3;
              local_78 = malloc(local_48);
              if (local_78 == (void *)0x0) {
                pcVar11 = "malloc b_data of REF_GLOB NULL";
                uVar8 = 0x127;
              }
              else {
                if ((int)local_98 < 0) {
                  pcVar11 = "malloc a_next of REF_INT negative";
                  uVar8 = 0x129;
                  goto LAB_001acbb9;
                }
                __ptr_00 = (undefined4 *)malloc(local_98 * 4);
                if (__ptr_00 != (undefined4 *)0x0) {
                  *__ptr_00 = 0;
                  iVar7 = 0;
                  for (uVar5 = 1; uVar5 < local_98; uVar5 = uVar5 + 1) {
                    iVar7 = iVar7 + send_size[uVar5 - 1];
                    __ptr_00[uVar5] = iVar7;
                  }
                  local_9c = (int)uVar5;
                  uVar5 = 0;
                  local_98 = (ulong)(uint)ref_edge->n;
                  local_80 = pvVar6;
                  if (ref_edge->n < 1) {
                    local_98 = uVar5;
                  }
                  for (; local_98 != uVar5; uVar5 = uVar5 + 1) {
                    ref_edge_part(ref_edge,(REF_INT)uVar5,&local_9c);
                    if (local_9c != ref_mpi->id) {
                      iVar7 = __ptr_00[local_9c];
                      *(REF_INT *)((long)local_70 + (long)iVar7 * 4) = (REF_INT)uVar5;
                      pRVar1 = ref_edge->e2n;
                      iVar9 = pRVar1[uVar5 * 2];
                      lVar12 = -1;
                      lVar3 = lVar12;
                      if (((-1 < (long)iVar9) && (iVar9 < local_88->max)) &&
                         (lVar3 = local_88->global[iVar9], local_88->global[iVar9] < 0)) {
                        lVar3 = lVar12;
                      }
                      *(long *)((long)local_68 + (long)iVar7 * 0x10) = lVar3;
                      iVar9 = pRVar1[uVar5 * 2 + 1];
                      lVar3 = lVar12;
                      if (((-1 < (long)iVar9) && (iVar9 < local_88->max)) &&
                         (lVar3 = local_88->global[iVar9], local_88->global[iVar9] < 0)) {
                        lVar3 = lVar12;
                      }
                      *(long *)((long)local_68 + (long)(int)(iVar7 * 2 | 1) * 8) = lVar3;
                      __ptr_00[local_9c] = iVar7 + 1;
                    }
                  }
                  local_8c = (int)local_98;
                  uVar2 = ref_mpi_alltoallv(ref_mpi,local_68,send_size,local_80,pRVar4,2,2);
                  pvVar6 = local_80;
                  if (uVar2 == 0) {
                    uVar5 = 0;
                    while (__ptr = local_38, local_48 != uVar5) {
                      uVar2 = ref_node_local(local_88,*(REF_GLOB *)((long)pvVar6 + uVar5 * 2),&node0
                                            );
                      if (uVar2 != 0) {
                        pcVar11 = "loc 0";
                        uVar8 = 0x13f;
                        goto LAB_001ace64;
                      }
                      local_98 = uVar5;
                      uVar2 = ref_node_local(local_88,*(REF_GLOB *)((long)pvVar6 + uVar5 * 2 + 8),
                                             &node1);
                      if (uVar2 != 0) {
                        pcVar11 = "loc 1";
                        uVar8 = 0x140;
                        goto LAB_001ace64;
                      }
                      uVar2 = ref_edge_with(ref_edge,node0,node1,&local_8c);
                      if (uVar2 != 0) {
                        pcVar11 = "find edge";
                        uVar8 = 0x141;
                        goto LAB_001ace64;
                      }
                      *(REF_GLOB *)((long)local_78 + local_98) = local_50[local_8c];
                      uVar5 = local_98 + 8;
                    }
                    uVar2 = ref_mpi_alltoallv(ref_mpi,local_78,local_60,local_38,send_size,1,2);
                    if (uVar2 == 0) {
                      for (uVar5 = 0; local_40 != uVar5; uVar5 = uVar5 + 1) {
                        local_50[*(int *)((long)local_70 + uVar5 * 4)] =
                             *(REF_GLOB *)((long)__ptr + uVar5 * 8);
                      }
                      free(__ptr_00);
                      free(local_78);
                      free(local_80);
                      free(local_70);
                      free(__ptr);
                      free(local_68);
                      free(local_60);
                      free(send_size);
                      return 0;
                    }
                    pcVar11 = "alltoallv return data";
                    uVar8 = 0x147;
                  }
                  else {
                    pcVar11 = "alltoallv requested nodes";
                    uVar8 = 0x13c;
                  }
LAB_001ace64:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,uVar8,"ref_edge_ghost_glob",(ulong)uVar2,pcVar11);
                  return uVar2;
                }
                pcVar11 = "malloc a_next of REF_INT NULL";
                uVar8 = 0x129;
              }
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar8,
         "ref_edge_ghost_glob",pcVar11);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_glob(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                       REF_GLOB *data) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_GLOB *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_GLOB);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_GLOB);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    b_data[request] = data[edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_edge[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}